

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>
::
push_and_compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,longdouble kappa,longdouble delta,longdouble theta,longdouble obj_amp)

{
  int k;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  bool bVar1;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var2;
  rc_size rVar3;
  _Head_base<0UL,_int_*,_false> _Var4;
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  rc_data *__first;
  rc_data *prVar10;
  undefined1 local_98 [16];
  _Head_base<0UL,_int_*,_false> local_88;
  rc_data *local_80;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> local_78;
  solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>
  *local_70;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_68;
  longdouble local_60;
  longdouble local_54;
  longdouble local_48;
  longdouble local_3c;
  
  local_3c = delta;
  local_48 = kappa;
  _Var2._M_current = (first->current)._M_current;
  if (_Var2._M_current == (last->current)._M_current) {
    bVar9 = false;
  }
  else {
    local_70 = this + 0x10;
    local_60 = theta;
    local_54 = obj_amp;
    bVar9 = false;
    local_88._M_head_impl = (int *)last;
    local_78._M_head_impl = (row_value *)x;
    local_68._M_head_impl = (col_value *)first;
    do {
      k = _Var2._M_current[-1];
      sparse_matrix<int>::row((sparse_matrix<int> *)local_98,(int)local_70);
      if (local_98._8_8_ != local_98._0_8_) {
        lVar8 = *(long *)(this + 0x50);
        _Var4._M_head_impl = (int *)local_98._8_8_;
        do {
          iVar5 = *_Var4._M_head_impl;
          _Var4._M_head_impl = _Var4._M_head_impl + 8;
          *(longdouble *)(lVar8 + (long)iVar5 * 0x10) =
               *(longdouble *)(lVar8 + (long)iVar5 * 0x10) * local_60;
        } while (_Var4._M_head_impl != (int *)local_98._0_8_);
      }
      rVar3 = solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
              ::compute_reduced_costs<baryonyx::bit_array>
                        ((solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                          *)this,(row_iterator)local_98._8_8_,(row_iterator)local_98._0_8_,x);
      __first = *(rc_data **)(this + 0x60);
      iVar5 = rVar3.r_size;
      if (iVar5 != 0) {
        lVar6 = 0;
        lVar8 = *(long *)(*(long *)(this + 0x78) + 8);
        do {
          *(longdouble *)((long)&__first->value + lVar6) =
               *(longdouble *)((long)&__first->value + lVar6) +
               *(longdouble *)
                (lVar8 + (long)((row_iterator)
                               (local_98._8_8_ + (long)*(int *)((long)&__first->id + lVar6) * 8))->
                               column * 0x10) * local_54;
          lVar6 = lVar6 + 0x20;
        } while (((ulong)rVar3 & 0xffffffff) << 5 != lVar6);
      }
      lVar8 = (long)iVar5;
      if (1 < lVar8) {
        prVar10 = __first + lVar8;
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        std::
        __introsort_loop<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar10,(int)LZCOUNT(lVar8) * 2 ^ 0x7e);
        local_80 = prVar10;
        std::
        __final_insertion_sort<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar10);
        lVar8 = lVar8 * 0x20 + -0x20;
        prVar10 = __first;
        do {
          prVar10 = prVar10 + 1;
          if ((__first->value != prVar10->value) || (NAN(__first->value) || NAN(prVar10->value))) {
            std::
            shuffle<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,prVar10,__g);
            __first = prVar10;
          }
          lVar8 = lVar8 + -0x20;
        } while (lVar8 != 0);
        std::
        shuffle<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,local_80,__g);
        last = (reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                *)local_88;
      }
      x = (bit_array *)local_78._M_head_impl;
      iVar7 = rVar3.c_size + *(int *)(*(long *)(this + 0x68) + (long)k * 8);
      if (iVar5 < iVar7) {
        iVar7 = iVar5;
      }
      bVar1 = affect<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                        ((solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                          *)this,(bit_array *)local_78._M_head_impl,(row_value *)local_98._8_8_,k,
                         iVar7 + -1,iVar5,local_48,local_3c);
      bVar9 = (bool)(bVar9 | bVar1);
      _Var2._M_current = *(int **)local_68._M_head_impl + -1;
      *local_68._M_head_impl = (col_value)_Var2._M_current;
    } while (_Var2._M_current != *(int **)last);
  }
  return bVar9;
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != sizes.r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].value);

            logger::log("constraints {}: {} = ", k, b[k].value);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }